

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeViewPrivate::expand(QTreeViewPrivate *this,int item,bool emitSignal)

{
  State SVar1;
  QAbstractItemView *this_00;
  QAbstractItemModel *pQVar2;
  char cVar3;
  ItemFlags IVar4;
  QTreeViewItem *pQVar5;
  pointer pQVar6;
  long in_FS_OFFSET;
  QPersistentModelIndex local_60;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (item != -1) {
    pQVar5 = (this->viewItems).d.ptr;
    if ((pQVar5[item].field_0x1c & 1) == 0) {
      this_00 = *(QAbstractItemView **)
                 &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                  super_QFramePrivate.super_QWidgetPrivate.field_0x8;
      pQVar5 = pQVar5 + item;
      local_58.m.ptr = (pQVar5->index).m.ptr;
      local_58.r = (pQVar5->index).r;
      local_58.c = (pQVar5->index).c;
      local_58.i = (pQVar5->index).i;
      IVar4 = QModelIndex::flags(&local_58);
      if (-1 < (char)IVar4.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
                     super_QFlagsStorage<Qt::ItemFlag>.i) {
        if ((emitSignal) && (this->animationsEnabled == true)) {
          prepareAnimatedOperation(this,item,Forward);
        }
        SVar1 = (this->super_QAbstractItemViewPrivate).state;
        if (SVar1 != AnimatingState) {
          (this->super_QAbstractItemViewPrivate).stateBeforeAnimation = SVar1;
        }
        QAbstractItemView::setState(this_00,ExpandingState);
        QPersistentModelIndex::QPersistentModelIndex(&local_60,&local_58);
        storeExpanded(this,&local_60);
        QPersistentModelIndex::~QPersistentModelIndex(&local_60);
        pQVar6 = QList<QTreeViewItem>::data(&this->viewItems);
        pQVar6[item].field_0x1c = pQVar6[item].field_0x1c | 1;
        layout(this,item,false,false);
        QAbstractItemView::setState
                  (this_00,(this->super_QAbstractItemViewPrivate).stateBeforeAnimation);
        pQVar2 = (this->super_QAbstractItemViewPrivate).model;
        cVar3 = (**(code **)(*(long *)pQVar2 + 0x130))(pQVar2,&local_58);
        if (cVar3 != '\0') {
          pQVar2 = (this->super_QAbstractItemViewPrivate).model;
          (**(code **)(*(long *)pQVar2 + 0x128))(pQVar2,&local_58);
        }
        if (emitSignal) {
          QTreeView::expanded((QTreeView *)this_00,&local_58);
          if (this->animationsEnabled == true) {
            beginAnimatedOperation(this);
          }
        }
        updateAccessibility(this);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::expand(int item, bool emitSignal)
{
    Q_Q(QTreeView);

    if (item == -1 || viewItems.at(item).expanded)
        return;
    const QModelIndex index = viewItems.at(item).index;
    if (index.flags() & Qt::ItemNeverHasChildren)
        return;

#if QT_CONFIG(animation)
    if (emitSignal && animationsEnabled)
        prepareAnimatedOperation(item, QVariantAnimation::Forward);
#endif // animation
     //if already animating, stateBeforeAnimation is set to the correct value
    if (state != QAbstractItemView::AnimatingState)
        stateBeforeAnimation = state;
    q->setState(QAbstractItemView::ExpandingState);
    storeExpanded(index);
    viewItems[item].expanded = true;
    layout(item);
    q->setState(stateBeforeAnimation);

    if (model->canFetchMore(index))
        model->fetchMore(index);
    if (emitSignal) {
        emit q->expanded(index);
#if QT_CONFIG(animation)
        if (animationsEnabled)
            beginAnimatedOperation();
#endif // animation
    }
    updateAccessibility();
}